

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupOutputGroup(Gia_Man_t *p,int iOutStart,int iOutStop)

{
  Gia_Man_t *pNew;
  char *pcVar1;
  Gia_Obj_t *pObj;
  
  Gia_ManFillValue(p);
  pNew = Gia_ManStart(p->nObjs);
  pcVar1 = Abc_UtilStrsav(p->pName);
  pNew->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(p->pSpec);
  pNew->pSpec = pcVar1;
  p->pObjs->Value = 0;
  for (; iOutStart < iOutStop; iOutStart = iOutStart + 1) {
    pObj = Gia_ManCo(p,iOutStart);
    Gia_ManDupOrderDfs_rec(pNew,p,pObj);
  }
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManDupOutputGroup( Gia_Man_t * p, int iOutStart, int iOutStop )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    for ( i = iOutStart; i < iOutStop; i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    }
    return pNew;
}